

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void platform_call_wrapper
               (void *ptr,StackFrame **arguments,size_t argcount,size_t outsize,bool varargs,VM *vm)

{
  int64_t *arguments_00;
  ulong outsize_00;
  size_t i;
  size_t sVar1;
  size_t retval;
  size_t local_38;
  
  outsize_00 = argcount * 8;
  arguments_00 = (int64_t *)operator_new__(-(ulong)(argcount >> 0x3d != 0) | outsize_00);
  for (sVar1 = 0; argcount != sVar1; sVar1 = sVar1 + 1) {
    memcpy(arguments_00 + sVar1,arguments[sVar1]->ptr,arguments[sVar1]->size);
  }
  local_38 = x86_call_wrapper(ptr,arguments_00,argcount,outsize_00,varargs);
  if (outsize != 0) {
    VM::push(vm,&local_38,outsize);
  }
  operator_delete__(arguments_00);
  return;
}

Assistant:

void platform_call_wrapper(void* ptr, StackFrame** arguments, size_t argcount, size_t outsize, bool varargs, VM* vm) {
  int64_t* args = new int64_t[argcount];
  for(size_t i = 0;i<argcount;i++) {
    memcpy(args+i,arguments[i]->ptr,arguments[i]->size);
  }
  size_t retval = x86_call_wrapper(ptr,args,argcount,outsize,varargs);
  if(outsize) {
    vm->push(&retval,outsize);
  }
  delete[] args;
}